

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

int Ssw_SecSpecial(Aig_Man_t *pPart0,Aig_Man_t *pPart1,int nFrames,int fVerbose)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int nOuts;
  Aig_Man_t *pMiterCec;
  timespec local_40;
  Aig_Man_t *local_30;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_40.tv_nsec / 1000 +
            CONCAT44(local_40.tv_sec._4_4_,(uint)local_40.tv_sec) * 1000000;
  }
  if (fVerbose == 0) {
    local_30 = Saig_ManCreateMiterTwo(pPart0,pPart1,nFrames);
  }
  else {
    Aig_ManPrintStats(pPart0);
    Aig_ManPrintStats(pPart1);
    local_30 = Saig_ManCreateMiterTwo(pPart0,pPart1,nFrames);
    Aig_ManPrintStats(local_30);
  }
  iVar1 = Fra_FraigCec(&local_30,100000,fVerbose);
  if (iVar1 == 0) {
    iVar1 = 0x8752bc;
    printf("Networks are NOT EQUIVALENT.   ");
    Abc_Print(iVar1,"%s =","Time");
    iVar3 = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar2 = -1;
    }
    else {
      lVar2 = local_40.tv_nsec / 1000 +
              CONCAT44(local_40.tv_sec._4_4_,(uint)local_40.tv_sec) * 1000000;
    }
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar2 - lVar5) / 1000000.0);
    if ((int *)local_30->pData == (int *)0x0) {
      pcVar4 = "Counter-example is not available.";
    }
    else {
      iVar1 = Ssw_SecCexResimulate(local_30,(int *)local_30->pData,(int *)&local_40);
      if (iVar1 != -1) {
        iVar3 = pPart0->nTruePos;
        if (iVar1 < nFrames * iVar3) {
          printf("Primary output %d has failed in frame %d.\n",
                 (long)iVar1 % (long)iVar3 & 0xffffffff,(long)iVar1 / (long)iVar3 & 0xffffffff);
        }
        else {
          printf("Flop input %d has failed in the last frame.\n");
        }
        printf("The counter-example detected %d incorrect POs or flop inputs.\n",
               (ulong)(uint)local_40.tv_sec);
        goto LAB_0066362b;
      }
      pcVar4 = "Counter-example verification has failed.";
    }
    puts(pcVar4);
  }
  else {
    if (iVar1 == 1) {
      pcVar4 = "Networks are equivalent.   ";
    }
    else {
      pcVar4 = "Networks are UNDECIDED.   ";
    }
    printf(pcVar4);
    Abc_Print((int)pcVar4,"%s =","Time");
    iVar3 = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar2 = -1;
    }
    else {
      lVar2 = local_40.tv_nsec / 1000 +
              CONCAT44(local_40.tv_sec._4_4_,(uint)local_40.tv_sec) * 1000000;
    }
    Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar2 - lVar5) / 1000000.0);
  }
LAB_0066362b:
  fflush(_stdout);
}

Assistant:

int Ssw_SecSpecial( Aig_Man_t * pPart0, Aig_Man_t * pPart1, int nFrames, int fVerbose )
{
//    extern int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose );
    int iOut, nOuts;
    Aig_Man_t * pMiterCec;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
//    Aig_ManDumpBlif( pPart0, "file0.blif", NULL, NULL );
//    Aig_ManDumpBlif( pPart1, "file1.blif", NULL, NULL );
//    assert( Aig_ManNodeNum(pPart0) <= Aig_ManNodeNum(pPart1) );
/*
    if ( Aig_ManNodeNum(pPart0) >= Aig_ManNodeNum(pPart1) )
    {
        printf( "Warning: The design after synthesis is smaller!\n" );
        printf( "This warning may indicate that the order of designs is changed.\n" );
        printf( "The solver expects the original design as first argument and\n" );
        printf( "the modified design as the second argument in \"absec\".\n" );
    }
*/
    // create two-level miter
    pMiterCec = Saig_ManCreateMiterTwo( pPart0, pPart1, nFrames );
    if ( fVerbose )
    {
        Aig_ManPrintStats( pMiterCec );
//        Aig_ManDumpBlif( pMiterCec, "miter01.blif", NULL, NULL );
//        printf( "The new miter is written into file \"%s\".\n", "miter01.blif" );
    }
    // run CEC on this miter
    RetValue = Fra_FraigCec( &pMiterCec, 100000, fVerbose );
    // transfer model if given
//    if ( pNtk2 == NULL )
//        pNtk1->pModel = pMiterCec->pData, pMiterCec->pData = NULL;
    // report the miter
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
        if ( pMiterCec->pData == NULL )
            printf( "Counter-example is not available.\n" );
        else
        {
            iOut = Ssw_SecCexResimulate( pMiterCec, (int *)pMiterCec->pData, &nOuts );
            if ( iOut == -1 )
                printf( "Counter-example verification has failed.\n" );
            else 
            {
                if ( iOut < Saig_ManPoNum(pPart0) * nFrames )
                    printf( "Primary output %d has failed in frame %d.\n", 
                        iOut%Saig_ManPoNum(pPart0), iOut/Saig_ManPoNum(pPart0) );
                else
                    printf( "Flop input %d has failed in the last frame.\n", 
                        iOut - Saig_ManPoNum(pPart0) * nFrames );
                printf( "The counter-example detected %d incorrect POs or flop inputs.\n", nOuts );
            }
        }
    }
    else
    {
        printf( "Networks are UNDECIDED.   " );
ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    fflush( stdout );
    Aig_ManStop( pMiterCec );
    return RetValue;
}